

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O0

int find_ref_match_in_left_nbs(int total_mi_rows,MACROBLOCKD *xd)

{
  long lVar1;
  int iVar2;
  int iVar3;
  MB_MODE_INFO *mbmi;
  int iVar4;
  int *in_RSI;
  int in_EDI;
  int match_found;
  MB_MODE_INFO **left_mi;
  int left_mi_row;
  uint8_t mi_step;
  int end_row;
  MB_MODE_INFO **prev_col_mi;
  MB_MODE_INFO **cur_mbmi;
  int mi_row;
  int local_44;
  undefined4 in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffd0;
  int local_4;
  
  if ((*(byte *)((long)in_RSI + 0x1ec1) & 1) == 0) {
    local_4 = 1;
  }
  else {
    iVar3 = *in_RSI;
    lVar1 = *(long *)(in_RSI + 0x7ae);
    iVar4 = iVar3 * in_RSI[2];
    if ((int)(iVar3 + (uint)*(byte *)((long)in_RSI + 0x2075)) < in_EDI) {
      in_EDI = iVar3 + (uint)*(byte *)((long)in_RSI + 0x2075);
    }
    for (; iVar3 < in_EDI; iVar3 = (in_stack_ffffffffffffffd0 >> 0x18) + iVar3) {
      mbmi = (MB_MODE_INFO *)(lVar1 + -8 + (long)iVar4 * -8 + (long)(iVar3 * in_RSI[2]) * 8);
      in_stack_ffffffffffffffd0 =
           CONCAT13("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                    [**(byte **)mbmi],(int3)in_stack_ffffffffffffffd0);
      local_44 = 0;
      iVar2 = is_inter_block(mbmi);
      if (iVar2 != 0) {
        local_44 = ref_match_found_in_nb_blocks
                             ((MB_MODE_INFO *)CONCAT44(in_EDI,in_stack_ffffffffffffffd0),
                              (MB_MODE_INFO *)CONCAT44(iVar3,in_stack_ffffffffffffffc8));
      }
      if (local_44 != 0) {
        return 1;
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static inline int find_ref_match_in_left_nbs(const int total_mi_rows,
                                             MACROBLOCKD *xd) {
  if (!xd->left_available) return 1;
  const int mi_row = xd->mi_row;
  MB_MODE_INFO **cur_mbmi = xd->mi;
  // prev_col_mi points into the mi array, starting at the top of the
  // previous column
  MB_MODE_INFO **prev_col_mi = xd->mi - 1 - mi_row * xd->mi_stride;
  const int end_row = AOMMIN(mi_row + xd->height, total_mi_rows);
  uint8_t mi_step;
  for (int left_mi_row = mi_row; left_mi_row < end_row;
       left_mi_row += mi_step) {
    MB_MODE_INFO **left_mi = prev_col_mi + left_mi_row * xd->mi_stride;
    mi_step = mi_size_high[left_mi[0]->bsize];
    int match_found = 0;
    if (is_inter_block(*left_mi))
      match_found = ref_match_found_in_nb_blocks(*cur_mbmi, *left_mi);
    if (match_found) return 1;
  }
  return 0;
}